

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcSimpleProperty::~IfcSimpleProperty(IfcSimpleProperty *this)

{
  ~IfcSimpleProperty((IfcSimpleProperty *)
                     ((long)&(this->super_IfcProperty).
                             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>.
                             _vptr_ObjectHelper +
                     (long)(this->super_IfcProperty).
                           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>.
                           _vptr_ObjectHelper[-3]));
  return;
}

Assistant:

IfcSimpleProperty() : Object("IfcSimpleProperty") {}